

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

int N_VConstrMaskLocal_ManyVector(N_Vector c,N_Vector x,N_Vector m)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int subval;
  int val;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  bool local_32;
  bool local_31;
  uint local_2c;
  long local_28;
  
  local_2c = 1;
  for (local_28 = 0; local_28 < *(long *)*in_RSI; local_28 = local_28 + 1) {
    if (*(long *)(*(long *)(*(long *)(*(long *)(*in_RSI + 0x10) + local_28 * 8) + 8) + 0x168) == 0)
    {
      iVar1 = N_VConstrMask(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_28 * 8),
                            *(undefined8 *)(*(long *)(*in_RSI + 0x10) + local_28 * 8),
                            *(undefined8 *)(*(long *)(*in_RDX + 0x10) + local_28 * 8));
      local_32 = local_2c != 0 && iVar1 != 0;
      local_31 = local_32;
    }
    else {
      iVar1 = N_VConstrMaskLocal(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_28 * 8),
                                 *(undefined8 *)(*(long *)(*in_RSI + 0x10) + local_28 * 8),
                                 *(undefined8 *)(*(long *)(*in_RDX + 0x10) + local_28 * 8));
      local_31 = local_2c != 0 && iVar1 != 0;
    }
    local_2c = (uint)local_31;
  }
  return local_2c;
}

Assistant:

sunbooleantype MVAPPEND(N_VConstrMaskLocal)(N_Vector c, N_Vector x, N_Vector m)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunbooleantype val, subval;

  /* initialize output*/
  val = SUNTRUE;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvconstrmasklocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvconstrmasklocal)
    {
      subval = N_VConstrMaskLocal(MANYVECTOR_SUBVEC(c, i),
                                  MANYVECTOR_SUBVEC(x, i),
                                  MANYVECTOR_SUBVEC(m, i));
      SUNCheckLastErrNoRet();
      val = (val && subval);

      /* otherwise, call nvconstrmask and accumulate to overall val */
    }
    else
    {
      subval = N_VConstrMask(MANYVECTOR_SUBVEC(c, i), MANYVECTOR_SUBVEC(x, i),
                             MANYVECTOR_SUBVEC(m, i));
      SUNCheckLastErrNoRet();
      val = (val && subval);
    }
  }

  return (val);
}